

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_tokenize.c
# Opt level: O2

C_Token * new_token(C_Parser *tokenizer,C_TokenKind kind,char *start,char *end)

{
  C_File *pCVar1;
  C_Token *pCVar2;
  
  pCVar2 = (C_Token *)
           (*tokenizer->memory_allocator->calloc)(tokenizer->memory_allocator->arena,1,0x80);
  pCVar2->kind = kind;
  pCVar2->loc = start;
  pCVar2->len = (int)end - (int)start;
  pCVar1 = tokenizer->current_file;
  pCVar2->file = pCVar1;
  pCVar2->filename = pCVar1->display_name;
  pCVar2->at_bol = tokenizer->at_bol;
  pCVar2->has_space = tokenizer->has_space;
  tokenizer->at_bol = false;
  tokenizer->has_space = false;
  return pCVar2;
}

Assistant:

static C_Token *new_token(C_Parser *tokenizer, C_TokenKind kind, char *start, char *end) {
  C_Token *tok = tokenizer->memory_allocator->calloc(tokenizer->memory_allocator->arena, 1, sizeof(C_Token));
  tok->kind = kind;
  tok->loc = start;
  tok->len = end - start;
  tok->file = tokenizer->current_file;
  tok->filename = tokenizer->current_file->display_name;
  tok->at_bol = tokenizer->at_bol;
  tok->has_space = tokenizer->has_space;

  tokenizer->at_bol = tokenizer->has_space = false;
  return tok;
}